

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
zeGetKernelExpProcAddrTable(ze_api_version_t version,ze_kernel_exp_dditable_t *pDdiTable)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar4;
  reference pvVar5;
  code *pcVar6;
  uint8_t *extraout_RDX;
  undefined1 auVar7 [16];
  ze_pfnKernelSetGlobalOffsetExp_t local_70;
  ze_kernel_exp_dditable_t dditable;
  ze_pfnGetKernelExpProcAddrTable_t getTable_2;
  ze_pfnGetKernelExpProcAddrTable_t getTable_1;
  ze_pfnGetKernelExpProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  ze_result_t result;
  ze_kernel_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar3 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar3 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (ze_kernel_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    __range1._4_4_ = ZE_RESULT_SUCCESS;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar2) {
      pdVar4 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar4->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar6 = (code *)dlsym(pdVar4->handle,"zeGetKernelExpProcAddrTable"),
         pcVar6 != (code *)0x0)) {
        __range1._4_4_ = (*pcVar6)(version,&(pdVar4->dditable).ze.KernelExp);
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar3 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar3 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar5 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                            (loader::context + 0x15e0));
        pDdiTable->pfnSetGlobalOffsetExp = (pvVar5->dditable).ze.KernelExp.pfnSetGlobalOffsetExp;
        pDdiTable->pfnSchedulingHintExp = (pvVar5->dditable).ze.KernelExp.pfnSchedulingHintExp;
        pDdiTable->pfnGetBinaryExp = (pvVar5->dditable).ze.KernelExp.pfnGetBinaryExp;
      }
      else {
        pDdiTable->pfnSetGlobalOffsetExp = loader::zeKernelSetGlobalOffsetExp;
        pDdiTable->pfnGetBinaryExp = loader::zeKernelGetBinaryExp;
        pDdiTable->pfnSchedulingHintExp = loader::zeKernelSchedulingHintExp;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar6 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),"zeGetKernelExpProcAddrTable"
                            );
      if (pcVar6 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar6)(version,pDdiTable);
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1620) != 0)) {
      auVar7 = dlsym(*(undefined8 *)(loader::context + 0x1620),"zeGetKernelExpProcAddrTable");
      dditable.pfnGetBinaryExp = auVar7._0_8_;
      if (dditable.pfnGetBinaryExp == (ze_pfnKernelGetBinaryExp_t)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      local_70 = pDdiTable->pfnSetGlobalOffsetExp;
      dditable.pfnSetGlobalOffsetExp =
           (ze_pfnKernelSetGlobalOffsetExp_t)pDdiTable->pfnSchedulingHintExp;
      dditable.pfnSchedulingHintExp = (ze_pfnKernelSchedulingHintExp_t)pDdiTable->pfnGetBinaryExp;
      __range1._4_4_ =
           (*dditable.pfnGetBinaryExp)
                     ((ze_kernel_handle_t)(ulong)version,(size_t *)&local_70,auVar7._8_8_);
      lVar1 = loader::context;
      *(ze_pfnKernelSetGlobalOffsetExp_t *)(loader::context + 0x1c10) = local_70;
      *(ze_pfnKernelSetGlobalOffsetExp_t *)(lVar1 + 0x1c18) = dditable.pfnSetGlobalOffsetExp;
      *(ze_pfnKernelSchedulingHintExp_t *)(lVar1 + 0x1c20) = dditable.pfnSchedulingHintExp;
      if ((*(byte *)(loader::context + 0x1652) & 1) != 0) {
        __range1._4_4_ =
             (*dditable.pfnGetBinaryExp)
                       ((ze_kernel_handle_t)(ulong)version,(size_t *)pDdiTable,extraout_RDX);
      }
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_exp_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetKernelExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetKernelExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.KernelExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnSetGlobalOffsetExp                       = loader::zeKernelSetGlobalOffsetExp;
            pDdiTable->pfnGetBinaryExp                             = loader::zeKernelGetBinaryExp;
            pDdiTable->pfnSchedulingHintExp                        = loader::zeKernelSchedulingHintExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.KernelExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetKernelExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetKernelExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetKernelExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetKernelExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_kernel_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_kernel_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.KernelExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}